

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O1

bool __thiscall
libcellml::Importer::ImporterImpl::checkComponentForCycles
          (ImporterImpl *this,ComponentPtr *component,History *history)

{
  element_type *peVar1;
  IssueImpl *pIVar2;
  AnyCellmlElementImpl *pAVar3;
  bool bVar4;
  long *plVar5;
  undefined8 *puVar6;
  element_type *peVar7;
  long *plVar8;
  element_type *peVar9;
  element_type *peVar10;
  ulong *puVar11;
  bool bVar12;
  undefined8 uVar13;
  IssuePtr issue;
  IssuePtr issue_1;
  ComponentPtr importedComponent;
  HistoryEpochPtr h;
  string resolvingUrl;
  ModelPtr model;
  ModelPtr componentModel;
  undefined1 local_1a0 [32];
  ComponentConstPtr local_180;
  element_type local_170;
  string local_140;
  IssuePtr local_120;
  element_type local_110;
  long *local_100;
  long local_f8;
  long local_f0;
  long lStack_e8;
  IssuePtr local_e0;
  string local_d0;
  ComponentEntity local_b0;
  HistoryEpochPtr local_a0;
  string local_90;
  ImportSource local_70;
  string local_50;
  
  ImportedEntity::importSource
            (&((component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->super_ImportedEntity);
  resolvingUrl_abi_cxx11_(&local_90,this,(ImportSourcePtr *)local_1a0);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a0._8_8_);
  }
  local_1a0._0_8_ =
       (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_1a0._8_8_ =
       (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
       ._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a0._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a0._8_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a0._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a0._8_8_)->_M_use_count + 1;
    }
  }
  owningModel((ParentedEntityConstPtr *)
              &local_70.super_enable_shared_from_this<libcellml::ImportSource>);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a0._8_8_);
  }
  local_180.super___shared_ptr<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_180.super___shared_ptr<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  if (local_180.super___shared_ptr<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_180.super___shared_ptr<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_180.super___shared_ptr<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_180.super___shared_ptr<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_180.super___shared_ptr<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  modelUrl_abi_cxx11_((string *)local_1a0,this,
                      (ModelPtr *)&local_70.super_enable_shared_from_this<libcellml::ImportSource>);
  createHistoryEpoch((libcellml *)&local_a0,&local_180,(string *)local_1a0,&local_90);
  peVar1 = (element_type *)(local_1a0 + 0x10);
  if ((element_type *)local_1a0._0_8_ != peVar1) {
    operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
  }
  if (local_180.super___shared_ptr<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_180.super___shared_ptr<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  ImportedEntity::importSource
            (&((component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->super_ImportedEntity);
  local_1a0._0_8_ = peVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"flatten","");
  bVar4 = checkForImportCycles
                    (this,(ImportSourcePtr *)&local_180,history,&local_a0,(string *)local_1a0);
  if ((element_type *)local_1a0._0_8_ != peVar1) {
    operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
  }
  if (local_180.super___shared_ptr<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_180.super___shared_ptr<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  bVar12 = true;
  if (bVar4) goto LAB_00229da2;
  std::
  vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
  ::push_back(history,&local_a0);
  ImportedEntity::importSource
            (&((component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->super_ImportedEntity);
  ImportSource::model(&local_70);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a0._8_8_);
  }
  if ((string *)local_70.super_Entity._vptr_Entity == (string *)0x0) {
    Issue::IssueImpl::create();
    pIVar2 = (local_120.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             mPimpl;
    NamedEntity::name_abi_cxx11_
              (&local_140,
               (NamedEntity *)
               (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr);
    puVar6 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_140,0,(char *)0x0,0x2b6f4a);
    local_170.super_ImportedEntity._vptr_ImportedEntity =
         (_func_int **)&local_170.super_enable_shared_from_this<libcellml::Component>;
    plVar5 = puVar6 + 2;
    if ((enable_shared_from_this<libcellml::Component> *)*puVar6 ==
        (enable_shared_from_this<libcellml::Component> *)plVar5) {
      local_170.super_enable_shared_from_this<libcellml::Component>._M_weak_this.
      super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)*plVar5;
      local_170.super_enable_shared_from_this<libcellml::Component>._M_weak_this.
      super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar6[3];
    }
    else {
      local_170.super_enable_shared_from_this<libcellml::Component>._M_weak_this.
      super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)*plVar5;
      local_170.super_ImportedEntity._vptr_ImportedEntity = (_func_int **)*puVar6;
    }
    local_170.super_ImportedEntity.mPimpl = (ImportedEntityImpl *)puVar6[1];
    *puVar6 = plVar5;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_170.super_ImportedEntity);
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_f0 = *plVar8;
      lStack_e8 = plVar5[3];
      local_100 = &local_f0;
    }
    else {
      local_f0 = *plVar8;
      local_100 = (long *)*plVar5;
    }
    local_f8 = plVar5[1];
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_100,(ulong)local_90._M_dataplus._M_p);
    peVar9 = (element_type *)(plVar5 + 2);
    if ((element_type *)*plVar5 == peVar9) {
      local_170.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.
      _vptr_Entity = (peVar9->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.
                     super_Entity._vptr_Entity;
      local_170.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl =
           (EntityImpl *)plVar5[3];
      local_180.super___shared_ptr<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           &local_170;
    }
    else {
      local_170.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.
      _vptr_Entity = (peVar9->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.
                     super_Entity._vptr_Entity;
      local_180.super___shared_ptr<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)*plVar5;
    }
    local_180.super___shared_ptr<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar5[1];
    *plVar5 = (long)peVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_180);
    peVar10 = (element_type *)(plVar5 + 2);
    if ((element_type *)*plVar5 == peVar10) {
      local_1a0._16_8_ =
           (peVar10->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
           _vptr_Entity;
      local_1a0._24_8_ = plVar5[3];
      local_1a0._0_8_ = peVar1;
    }
    else {
      local_1a0._16_8_ =
           (peVar10->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
           _vptr_Entity;
      local_1a0._0_8_ = (element_type *)*plVar5;
    }
    local_1a0._8_8_ = plVar5[1];
    *plVar5 = (long)peVar10;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    Issue::IssueImpl::setDescription(pIVar2,(string *)local_1a0);
    if ((element_type *)local_1a0._0_8_ != peVar1) {
      operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
    }
    if (local_180.super___shared_ptr<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != &local_170) {
      operator_delete(local_180.
                      super___shared_ptr<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,(long)local_170.super_ComponentEntity.super_NamedEntity.
                                   super_ParentedEntity.super_Entity._vptr_Entity + 1);
    }
    if (local_100 != &local_f0) {
      operator_delete(local_100,local_f0 + 1);
    }
    if ((enable_shared_from_this<libcellml::Component> *)
        local_170.super_ImportedEntity._vptr_ImportedEntity !=
        &local_170.super_enable_shared_from_this<libcellml::Component>) {
      operator_delete(local_170.super_ImportedEntity._vptr_ImportedEntity,
                      (ulong)((long)&((local_170.super_enable_shared_from_this<libcellml::Component>
                                       ._M_weak_this.
                                       super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->super_ComponentEntity).super_NamedEntity.
                                     super_ParentedEntity.super_Entity._vptr_Entity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    pAVar3 = (((local_120.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl->mItem).
              super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             mPimpl;
    ImportedEntity::importSource
              (&((component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->super_ImportedEntity);
    AnyCellmlElement::AnyCellmlElementImpl::setImportSource(pAVar3,(ImportSourcePtr *)local_1a0);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a0._8_8_);
    }
    Issue::IssueImpl::setReferenceRule
              ((local_120.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl,IMPORTER_NULL_MODEL);
    Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&local_120);
    if (local_120.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_120.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    bVar12 = true;
  }
  else {
    ImportedEntity::importReference_abi_cxx11_
              ((string *)local_1a0,
               &((component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->super_ImportedEntity);
    ComponentEntity::component
              (&local_b0,(string *)local_70.super_Entity._vptr_Entity,SUB81(local_1a0,0));
    if ((element_type *)local_1a0._0_8_ != peVar1) {
      operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
    }
    if (local_b0.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity ==
        (_func_int **)0x0) {
      Issue::IssueImpl::create();
      pIVar2 = (local_e0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl;
      NamedEntity::name_abi_cxx11_
                (&local_50,
                 (NamedEntity *)
                 (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x2b6f4a);
      local_120.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &local_110
      ;
      peVar7 = (element_type *)(plVar5 + 2);
      if ((element_type *)*plVar5 == peVar7) {
        local_110._vptr_Issue = peVar7->_vptr_Issue;
        local_110.mPimpl = (IssueImpl *)plVar5[3];
      }
      else {
        local_110._vptr_Issue = peVar7->_vptr_Issue;
        local_120.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)*plVar5;
      }
      local_120.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar5[1];
      *plVar5 = (long)peVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_120);
      puVar11 = (ulong *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11) {
        local_140.field_2._M_allocated_capacity = *puVar11;
        local_140.field_2._8_8_ = plVar5[3];
        local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      }
      else {
        local_140.field_2._M_allocated_capacity = *puVar11;
        local_140._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_140._M_string_length = plVar5[1];
      *plVar5 = (long)puVar11;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      ImportedEntity::importReference_abi_cxx11_
                (&local_d0,
                 &((component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)
                  ._M_ptr)->super_ImportedEntity);
      uVar13 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        uVar13 = local_140.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar13 < local_d0._M_string_length + local_140._M_string_length) {
        uVar13 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          uVar13 = local_d0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar13 < local_d0._M_string_length + local_140._M_string_length)
        goto LAB_00229a8d;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_d0,0,(char *)0x0,(ulong)local_140._M_dataplus._M_p);
      }
      else {
LAB_00229a8d:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_140,(ulong)local_d0._M_dataplus._M_p);
      }
      local_170.super_ImportedEntity._vptr_ImportedEntity =
           (_func_int **)&local_170.super_enable_shared_from_this<libcellml::Component>;
      plVar5 = puVar6 + 2;
      if ((enable_shared_from_this<libcellml::Component> *)*puVar6 ==
          (enable_shared_from_this<libcellml::Component> *)plVar5) {
        local_170.super_enable_shared_from_this<libcellml::Component>._M_weak_this.
        super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)*plVar5;
        local_170.super_enable_shared_from_this<libcellml::Component>._M_weak_this.
        super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar6[3];
      }
      else {
        local_170.super_enable_shared_from_this<libcellml::Component>._M_weak_this.
        super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)*plVar5;
        local_170.super_ImportedEntity._vptr_ImportedEntity = (_func_int **)*puVar6;
      }
      local_170.super_ImportedEntity.mPimpl = (ImportedEntityImpl *)puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)plVar5 = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_170.super_ImportedEntity);
      plVar8 = plVar5 + 2;
      if ((long *)*plVar5 == plVar8) {
        local_f0 = *plVar8;
        lStack_e8 = plVar5[3];
        local_100 = &local_f0;
      }
      else {
        local_f0 = *plVar8;
        local_100 = (long *)*plVar5;
      }
      local_f8 = plVar5[1];
      *plVar5 = (long)plVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_100,(ulong)local_90._M_dataplus._M_p);
      peVar9 = (element_type *)(plVar5 + 2);
      if ((element_type *)*plVar5 == peVar9) {
        local_170.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.
        _vptr_Entity = (peVar9->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.
                       super_Entity._vptr_Entity;
        local_170.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl =
             (EntityImpl *)plVar5[3];
        local_180.super___shared_ptr<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = &local_170;
      }
      else {
        local_170.super_ComponentEntity.super_NamedEntity.super_ParentedEntity.super_Entity.
        _vptr_Entity = (peVar9->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.
                       super_Entity._vptr_Entity;
        local_180.super___shared_ptr<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)*plVar5;
      }
      local_180.super___shared_ptr<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar5[1];
      *plVar5 = (long)peVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_180);
      peVar10 = (element_type *)(plVar5 + 2);
      if ((element_type *)*plVar5 == peVar10) {
        local_1a0._16_8_ =
             (peVar10->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
             _vptr_Entity;
        local_1a0._24_8_ = plVar5[3];
        local_1a0._0_8_ = peVar1;
      }
      else {
        local_1a0._16_8_ =
             (peVar10->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.
             _vptr_Entity;
        local_1a0._0_8_ = (element_type *)*plVar5;
      }
      local_1a0._8_8_ = plVar5[1];
      *plVar5 = (long)peVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      Issue::IssueImpl::setDescription(pIVar2,(string *)local_1a0);
      if ((element_type *)local_1a0._0_8_ != peVar1) {
        operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
      }
      if (local_180.super___shared_ptr<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr != &local_170) {
        operator_delete(local_180.
                        super___shared_ptr<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,(long)local_170.super_ComponentEntity.super_NamedEntity.
                                     super_ParentedEntity.super_Entity._vptr_Entity + 1);
      }
      if (local_100 != &local_f0) {
        operator_delete(local_100,local_f0 + 1);
      }
      if ((enable_shared_from_this<libcellml::Component> *)
          local_170.super_ImportedEntity._vptr_ImportedEntity !=
          &local_170.super_enable_shared_from_this<libcellml::Component>) {
        operator_delete(local_170.super_ImportedEntity._vptr_ImportedEntity,
                        (ulong)((long)&((local_170.
                                         super_enable_shared_from_this<libcellml::Component>.
                                         _M_weak_this.
                                         super___weak_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->super_ComponentEntity).super_NamedEntity.
                                       super_ParentedEntity.super_Entity._vptr_Entity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      if (local_120.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          &local_110) {
        operator_delete(local_120.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,(long)local_110._vptr_Issue + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      pAVar3 = (((local_e0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                 ->mPimpl->mItem).
                super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->mPimpl;
      ImportedEntity::importSource
                (&((component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)
                  ._M_ptr)->super_ImportedEntity);
      AnyCellmlElement::AnyCellmlElementImpl::setImportSource(pAVar3,(ImportSourcePtr *)local_1a0);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a0._8_8_);
      }
      Issue::IssueImpl::setReferenceRule
                ((local_e0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                 ->mPimpl,IMPORTER_MISSING_COMPONENT);
      Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&local_e0);
      if (local_e0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_e0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      bVar12 = true;
    }
    else {
      bVar4 = ImportedEntity::isImport
                        ((ImportedEntity *)
                         (local_b0.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity
                         + 2));
      if (bVar4) {
        bVar4 = checkComponentForCycles(this,(ComponentPtr *)&local_b0,history);
        bVar12 = true;
        if (bVar4) goto LAB_00229d7e;
      }
      bVar12 = false;
    }
LAB_00229d7e:
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_b0.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_b0.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70.super_Entity.mPimpl !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70.super_Entity.mPimpl);
  }
LAB_00229da2:
  if (local_a0.super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a0.super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_70.super_enable_shared_from_this<libcellml::ImportSource>._M_weak_this.
      super___weak_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.super_enable_shared_from_this<libcellml::ImportSource>._M_weak_this.
               super___weak_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return bVar12;
}

Assistant:

bool Importer::ImporterImpl::checkComponentForCycles(const ComponentPtr &component, History &history)
{
    std::string resolvingUrl = ImporterImpl::resolvingUrl(component->importSource());
    auto componentModel = owningModel(component);
    auto h = createHistoryEpoch(component, modelUrl(componentModel), resolvingUrl);

    if (checkForImportCycles(component->importSource(), history, h, "flatten")) {
        return true;
    }

    history.push_back(h);

    // If the dependencies have not been recorded already, then check it.
    auto model = component->importSource()->model();
    if (model == nullptr) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Component '" + component->name() + "' requires a model imported from '" + resolvingUrl + "' which is not available in the importer.");
        issue->mPimpl->mItem->mPimpl->setImportSource(component->importSource());
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORTER_NULL_MODEL);
        addIssue(issue);
        return true;
    }
    auto importedComponent = model->component(component->importReference(), true);
    if (importedComponent == nullptr) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Component '" + component->name() + "' imports a component named '" + component->importReference() + "' from the model imported from '" + resolvingUrl + "'. The component could not be found.");
        issue->mPimpl->mItem->mPimpl->setImportSource(component->importSource());
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORTER_MISSING_COMPONENT);
        addIssue(issue);
        return true;
    }

    if (importedComponent->isImport() && checkComponentForCycles(importedComponent, history)) {
        return true;
    }

    return false;
}